

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphValidator.cpp
# Opt level: O0

void dg::pta::dumpNode(PSNode *nd,string *errors)

{
  PSNodeType PVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_t sVar2;
  PSNode *this;
  string *psVar3;
  string *in_RSI;
  PSNode *in_RDI;
  PSNode *op;
  uint e;
  uint i;
  size_t in_stack_fffffffffffffed8;
  SubgraphNode<dg::pta::PSNode> *in_stack_fffffffffffffee0;
  allocator local_109;
  string local_108 [4];
  uint in_stack_fffffffffffffefc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  uint local_bc;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  string *local_10;
  PSNode *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  PVar1 = PSNode::getType(in_RDI);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          PSNodeTypeToCString(PVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,(char *)__lhs,&local_91);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffee0);
  SubgraphNode<dg::pta::PSNode>::getID(&local_8->super_SubgraphNode<dg::pta::PSNode>);
  std::__cxx11::to_string(in_stack_fffffffffffffefc);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffee0);
  std::__cxx11::string::operator+=(local_10,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_bc = 0;
  sVar2 = SubgraphNode<dg::pta::PSNode>::getOperandsNum((SubgraphNode<dg::pta::PSNode> *)0x160f5f);
  for (; local_bc < (uint)sVar2; local_bc = local_bc + 1) {
    this = SubgraphNode<dg::pta::PSNode>::getOperand
                     (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    SubgraphNode<dg::pta::PSNode>::getID(&this->super_SubgraphNode<dg::pta::PSNode>);
    std::__cxx11::to_string(in_stack_fffffffffffffefc);
    psVar3 = (string *)std::__cxx11::string::operator+=((string *)&stack0xffffffffffffff18," ");
    std::__cxx11::string::operator+=(local_10,psVar3);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
    PVar1 = PSNode::getType(this);
    in_stack_fffffffffffffee0 = (SubgraphNode<dg::pta::PSNode> *)PSNodeTypeToCString(PVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,(char *)in_stack_fffffffffffffee0,&local_109);
    std::__cxx11::string::operator+=(local_10,local_108);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    if (local_bc != (uint)sVar2 - 1) {
      std::__cxx11::string::operator+=(local_10,", ");
    }
  }
  std::__cxx11::string::operator+=(local_10,"]\n");
  return;
}

Assistant:

static void dumpNode(const PSNode *nd, std::string &errors) {
    errors += std::string(PSNodeTypeToCString(nd->getType())) + " with ID " +
              std::to_string(nd->getID()) + "\n  - operands: [";
    for (unsigned i = 0, e = nd->getOperandsNum(); i < e; ++i) {
        const PSNode *op = nd->getOperand(i);
        errors += std::to_string(op->getID()) += " ";
        errors += std::string(PSNodeTypeToCString(op->getType()));
        if (i != e - 1)
            errors += ", ";
    }
    errors += "]\n";
}